

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedPipelineStateImpl.cpp
# Opt level: O3

PIPELINE_STATE_STATUS __thiscall
Diligent::SerializedPipelineStateImpl::GetStatus
          (SerializedPipelineStateImpl *this,bool WaitForCompletion)

{
  AsyncInitializer *this_00;
  ASYNC_TASK_STATUS AVar1;
  char (*in_RCX) [55];
  string msg;
  string local_38;
  
  if ((this->m_Status)._M_i == PIPELINE_STATE_STATUS_UNINITIALIZED) {
    FormatString<char[26],char[55]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Status.load() != PIPELINE_STATE_STATUS_UNINITIALIZED",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetStatus",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x1f5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = (this->m_AsyncInitializer)._M_t.
            super___uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
            ._M_t.
            super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
            .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl;
  if (this_00 != (AsyncInitializer *)0x0) {
    AVar1 = AsyncInitializer::Update(this_00,WaitForCompletion);
    if ((AVar1 == ASYNC_TASK_STATUS_COMPLETE) &&
       ((this->m_Status)._M_i < PIPELINE_STATE_STATUS_READY)) {
      FormatString<char[91]>
                (&local_38,
                 (char (*) [91])
                 "Pipeline state status must be atomically set by the initialization task before it finishes"
                );
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"GetStatus",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
                 ,0x1f9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return (this->m_Status)._M_i;
}

Assistant:

PIPELINE_STATE_STATUS SerializedPipelineStateImpl::GetStatus(bool WaitForCompletion)
{
    VERIFY_EXPR(m_Status.load() != PIPELINE_STATE_STATUS_UNINITIALIZED);
    ASYNC_TASK_STATUS InitTaskStatus = AsyncInitializer::Update(m_AsyncInitializer, WaitForCompletion);
    if (InitTaskStatus == ASYNC_TASK_STATUS_COMPLETE)
    {
        VERIFY(m_Status.load() > PIPELINE_STATE_STATUS_COMPILING, "Pipeline state status must be atomically set by the initialization task before it finishes");
    }
    return m_Status.load();
}